

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ObjCHelper_IsCreateName_Test::TestBody
          (ObjCHelper_IsCreateName_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *in_R9;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string local_860;
  AssertHelper local_840;
  Message local_838;
  basic_string_view<char,_std::char_traits<char>_> local_830;
  bool local_819;
  undefined1 local_818 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_7e8;
  Message local_7e0;
  basic_string_view<char,_std::char_traits<char>_> local_7d8;
  bool local_7c1;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_790;
  Message local_788;
  basic_string_view<char,_std::char_traits<char>_> local_780;
  bool local_769;
  undefined1 local_768 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_738;
  Message local_730;
  basic_string_view<char,_std::char_traits<char>_> local_728;
  bool local_711;
  undefined1 local_710 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_6e0;
  Message local_6d8;
  basic_string_view<char,_std::char_traits<char>_> local_6d0;
  bool local_6b9;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_688;
  Message local_680;
  basic_string_view<char,_std::char_traits<char>_> local_678;
  bool local_661;
  undefined1 local_660 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_630;
  Message local_628;
  basic_string_view<char,_std::char_traits<char>_> local_620;
  bool local_609;
  undefined1 local_608 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_5d8;
  Message local_5d0;
  basic_string_view<char,_std::char_traits<char>_> local_5c8;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_580;
  Message local_578;
  basic_string_view<char,_std::char_traits<char>_> local_570;
  bool local_559;
  undefined1 local_558 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_528;
  Message local_520;
  basic_string_view<char,_std::char_traits<char>_> local_518;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_4d0;
  Message local_4c8;
  basic_string_view<char,_std::char_traits<char>_> local_4c0;
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_478;
  Message local_470;
  basic_string_view<char,_std::char_traits<char>_> local_468;
  bool local_451;
  undefined1 local_450 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_420;
  Message local_418;
  basic_string_view<char,_std::char_traits<char>_> local_410;
  bool local_3f9;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_3c8;
  Message local_3c0;
  basic_string_view<char,_std::char_traits<char>_> local_3b8;
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_370;
  Message local_368;
  basic_string_view<char,_std::char_traits<char>_> local_360;
  bool local_349;
  undefined1 local_348 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_318;
  Message local_310;
  basic_string_view<char,_std::char_traits<char>_> local_308;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_2c0;
  Message local_2b8;
  basic_string_view<char,_std::char_traits<char>_> local_2b0;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_268;
  Message local_260;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_210;
  Message local_208;
  basic_string_view<char,_std::char_traits<char>_> local_200;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1b8;
  Message local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_160;
  Message local_158;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108;
  Message local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_b0;
  Message local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_58 [3];
  Message local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  ObjCHelper_IsCreateName_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"Create");
  name._M_str = extraout_RDX;
  name._M_len = (size_t)local_38._M_str;
  local_21 = IsCreateName((objectivec *)local_38._M_len,name);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)"IsCreateName(\"Create\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"Copy");
  name_00._M_str = extraout_RDX_00;
  name_00._M_len = (size_t)local_a0._M_str;
  local_89 = IsCreateName((objectivec *)local_a0._M_len,name_00);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_88,
               (AssertionResult *)"IsCreateName(\"Copy\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,"CreateFoo");
  name_01._M_str = extraout_RDX_01;
  name_01._M_len = (size_t)local_f8._M_str;
  local_e1 = IsCreateName((objectivec *)local_f8._M_len,name_01);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_e0,
               (AssertionResult *)"IsCreateName(\"CreateFoo\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,"CopyFoo");
  name_02._M_str = extraout_RDX_02;
  name_02._M_len = (size_t)local_150._M_str;
  local_139 = IsCreateName((objectivec *)local_150._M_len,name_02);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_138,
               (AssertionResult *)"IsCreateName(\"CopyFoo\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"Create_foo");
  name_03._M_str = extraout_RDX_03;
  name_03._M_len = (size_t)local_1a8._M_str;
  local_191 = IsCreateName((objectivec *)local_1a8._M_len,name_03);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_190,&local_191,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_190,
               (AssertionResult *)"IsCreateName(\"Create_foo\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_200,"Copy_foo");
  name_04._M_str = extraout_RDX_04;
  name_04._M_len = (size_t)local_200._M_str;
  local_1e9 = IsCreateName((objectivec *)local_200._M_len,name_04);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_1e8,
               (AssertionResult *)"IsCreateName(\"Copy_foo\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258,"ReCreate");
  name_05._M_str = extraout_RDX_05;
  name_05._M_len = (size_t)local_258._M_str;
  local_241 = IsCreateName((objectivec *)local_258._M_len,name_05);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_240,&local_241,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_240,
               (AssertionResult *)"IsCreateName(\"ReCreate\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2b0,"ReCopy");
  name_06._M_str = extraout_RDX_06;
  name_06._M_len = (size_t)local_2b0._M_str;
  local_299 = IsCreateName((objectivec *)local_2b0._M_len,name_06);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_298,&local_299,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_298,
               (AssertionResult *)"IsCreateName(\"ReCopy\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_308,"FOOCreate");
  name_07._M_str = extraout_RDX_07;
  name_07._M_len = (size_t)local_308._M_str;
  local_2f1 = IsCreateName((objectivec *)local_308._M_len,name_07);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_2f0,
               (AssertionResult *)"IsCreateName(\"FOOCreate\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_360,"FOOCopy");
  name_08._M_str = extraout_RDX_08;
  name_08._M_len = (size_t)local_360._M_str;
  local_349 = IsCreateName((objectivec *)local_360._M_len,name_08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_348,&local_349,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_348,
               (AssertionResult *)"IsCreateName(\"FOOCopy\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3b8,"CreateWithCopy");
  name_09._M_str = extraout_RDX_09;
  name_09._M_len = (size_t)local_3b8._M_str;
  local_3a1 = IsCreateName((objectivec *)local_3b8._M_len,name_09);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a0,&local_3a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_3a0,
               (AssertionResult *)"IsCreateName(\"CreateWithCopy\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_410,anon_var_dwarf_37cdd0 + 5);
  name_10._M_str = extraout_RDX_10;
  name_10._M_len = (size_t)local_410._M_str;
  bVar1 = IsCreateName((objectivec *)local_410._M_len,name_10);
  local_3f9 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f8,&local_3f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_3f8,
               (AssertionResult *)"IsCreateName(\"\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_468,"Crea");
  name_11._M_str = extraout_RDX_11;
  name_11._M_len = (size_t)local_468._M_str;
  bVar1 = IsCreateName((objectivec *)local_468._M_len,name_11);
  local_451 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_450,&local_451,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_450,
               (AssertionResult *)"IsCreateName(\"Crea\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=(&local_478,&local_470);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4c0,"Co");
  name_12._M_str = extraout_RDX_12;
  name_12._M_len = (size_t)local_4c0._M_str;
  bVar1 = IsCreateName((objectivec *)local_4c0._M_len,name_12);
  local_4a9 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a8,&local_4a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_4a8,
               (AssertionResult *)"IsCreateName(\"Co\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_518,"create");
  name_13._M_str = extraout_RDX_13;
  name_13._M_len = (size_t)local_518._M_str;
  bVar1 = IsCreateName((objectivec *)local_518._M_len,name_13);
  local_501 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_500,&local_501,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_500,
               (AssertionResult *)"IsCreateName(\"create\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_528,&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_570,"recreate");
  name_14._M_str = extraout_RDX_14;
  name_14._M_len = (size_t)local_570._M_str;
  bVar1 = IsCreateName((objectivec *)local_570._M_len,name_14);
  local_559 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_558,&local_559,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_558,
               (AssertionResult *)"IsCreateName(\"recreate\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_580,&local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5c8,"recopy");
  name_15._M_str = extraout_RDX_15;
  name_15._M_len = (size_t)local_5c8._M_str;
  bVar1 = IsCreateName((objectivec *)local_5c8._M_len,name_15);
  local_5b1 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b0,&local_5b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_5b0,
               (AssertionResult *)"IsCreateName(\"recopy\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_5d8);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_5d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_620,"ReCreated");
  name_16._M_str = extraout_RDX_16;
  name_16._M_len = (size_t)local_620._M_str;
  bVar1 = IsCreateName((objectivec *)local_620._M_len,name_16);
  local_609 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_608,&local_609,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_608,
               (AssertionResult *)"IsCreateName(\"ReCreated\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_630,&local_628);
    testing::internal::AssertHelper::~AssertHelper(&local_630);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_678,"ReCopying");
  name_17._M_str = extraout_RDX_17;
  name_17._M_len = (size_t)local_678._M_str;
  bVar1 = IsCreateName((objectivec *)local_678._M_len,name_17);
  local_661 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_660,&local_661,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar1) {
    testing::Message::Message(&local_680);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_660,
               (AssertionResult *)"IsCreateName(\"ReCopying\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_688,&local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6d0,"init");
  name_18._M_str = extraout_RDX_18;
  name_18._M_len = (size_t)local_6d0._M_str;
  bVar1 = IsCreateName((objectivec *)local_6d0._M_len,name_18);
  local_6b9 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b8,&local_6b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(&local_6d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_6b8,
               (AssertionResult *)"IsCreateName(\"init\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6e0,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_728,"new");
  name_19._M_str = extraout_RDX_19;
  name_19._M_len = (size_t)local_728._M_str;
  bVar1 = IsCreateName((objectivec *)local_728._M_len,name_19);
  local_711 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_710,&local_711,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
  if (!bVar1) {
    testing::Message::Message(&local_730);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_710,
               (AssertionResult *)"IsCreateName(\"new\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_738,&local_730);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_780,"alloc");
  name_20._M_str = extraout_RDX_20;
  name_20._M_len = (size_t)local_780._M_str;
  bVar1 = IsCreateName((objectivec *)local_780._M_len,name_20);
  local_769 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_768,&local_769,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_768);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_768,
               (AssertionResult *)"IsCreateName(\"alloc\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_768);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7d8,"copy");
  name_21._M_str = extraout_RDX_21;
  name_21._M_len = (size_t)local_7d8._M_str;
  bVar1 = IsCreateName((objectivec *)local_7d8._M_len,name_21);
  local_7c1 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7c0,&local_7c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(&local_7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_7c0,
               (AssertionResult *)"IsCreateName(\"copy\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e8,&local_7e0);
    testing::internal::AssertHelper::~AssertHelper(&local_7e8);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_7e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_830,"mutableCopy")
  ;
  name_22._M_str = extraout_RDX_22;
  name_22._M_len = (size_t)local_830._M_str;
  local_819 = IsCreateName((objectivec *)local_830._M_len,name_22);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_818,&local_819,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    testing::Message::Message(&local_838);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_860,(internal *)local_818,(AssertionResult *)"IsCreateName(\"mutableCopy\")",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_840,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/names_unittest.cc"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_840,&local_838);
    testing::internal::AssertHelper::~AssertHelper(&local_840);
    std::__cxx11::string::~string((string *)&local_860);
    testing::Message::~Message(&local_838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  return;
}

Assistant:

TEST(ObjCHelper, IsCreateName) {
  EXPECT_TRUE(IsCreateName("Create"));
  EXPECT_TRUE(IsCreateName("Copy"));
  EXPECT_TRUE(IsCreateName("CreateFoo"));
  EXPECT_TRUE(IsCreateName("CopyFoo"));
  EXPECT_TRUE(IsCreateName("Create_foo"));
  EXPECT_TRUE(IsCreateName("Copy_foo"));
  EXPECT_TRUE(IsCreateName("ReCreate"));
  EXPECT_TRUE(IsCreateName("ReCopy"));
  EXPECT_TRUE(IsCreateName("FOOCreate"));
  EXPECT_TRUE(IsCreateName("FOOCopy"));
  EXPECT_TRUE(IsCreateName("CreateWithCopy"));

  EXPECT_FALSE(IsCreateName(""));
  EXPECT_FALSE(IsCreateName("Crea"));
  EXPECT_FALSE(IsCreateName("Co"));
  EXPECT_FALSE(IsCreateName("create"));
  EXPECT_FALSE(IsCreateName("recreate"));
  EXPECT_FALSE(IsCreateName("recopy"));
  EXPECT_FALSE(IsCreateName("ReCreated"));
  EXPECT_FALSE(IsCreateName("ReCopying"));

  EXPECT_FALSE(IsCreateName("init"));
  EXPECT_FALSE(IsCreateName("new"));
  EXPECT_FALSE(IsCreateName("alloc"));
  EXPECT_FALSE(IsCreateName("copy"));
  EXPECT_TRUE(IsCreateName("mutableCopy"));
}